

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoding_backend_init_file_w__wav
                    (void *pUserData,wchar_t *pFilePath,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_decoding_backend_config pWav_00;
  wchar_t *in_RCX;
  ma_decoding_backend_config *in_R8;
  ma_wav *pWav;
  ma_result result;
  ma_allocation_callbacks *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  pWav_00 = (ma_decoding_backend_config)
            ma_malloc((size_t)in_stack_ffffffffffffffb8,(ma_allocation_callbacks *)0x26946c);
  if (pWav_00 == (ma_decoding_backend_config)0x0) {
    local_4 = MA_OUT_OF_MEMORY;
  }
  else {
    local_4 = ma_wav_init_file_w(in_RCX,in_R8,
                                 (ma_allocation_callbacks *)
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                 (ma_wav *)pWav_00);
    if (local_4 == MA_SUCCESS) {
      *in_R8 = pWav_00;
      local_4 = MA_SUCCESS;
    }
    else {
      ma_free((void *)pWav_00,in_stack_ffffffffffffffb8);
    }
  }
  return local_4;
}

Assistant:

static ma_result ma_decoding_backend_init_file_w__wav(void* pUserData, const wchar_t* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_wav* pWav;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pWav = (ma_wav*)ma_malloc(sizeof(*pWav), pAllocationCallbacks);
    if (pWav == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_wav_init_file_w(pFilePath, pConfig, pAllocationCallbacks, pWav);
    if (result != MA_SUCCESS) {
        ma_free(pWav, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pWav;

    return MA_SUCCESS;
}